

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int setbfe(match *res,bitfield *bf,expr *expr)

{
  long lVar1;
  ull uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (expr->isimm == 0) {
    uVar4 = 0;
  }
  else if ((expr->type == EXPR_NUM) && (bf->pcrel == 0)) {
    uVar8 = expr->num1 - bf->addend ^ bf->xorend;
    if (bf->lut != (ull *)0x0) {
      iVar3 = bf->sbf[1].len + bf->sbf[0].len;
      uVar4 = 1 << ((byte)iVar3 & 0x1f);
      uVar7 = 0;
      if (iVar3 != 0x1f) {
        uVar5 = 1;
        if (1 < (int)uVar4) {
          uVar5 = (ulong)uVar4;
        }
        uVar6 = 0;
        do {
          uVar7 = uVar6;
          if (bf->lut[uVar6] == uVar8) break;
          uVar6 = uVar6 + 1;
          uVar7 = uVar5;
        } while (uVar5 != uVar6);
      }
      uVar8 = uVar7 & 0xffffffff;
      if ((uint)uVar7 == uVar4) {
        return 0;
      }
    }
    uVar8 = uVar8 >> ((byte)bf->shr & 0x3f);
    setsbf(res,bf->sbf[0].pos,bf->sbf[0].len,uVar8);
    setsbf(res,bf->sbf[1].pos,bf->sbf[1].len,uVar8 >> ((byte)bf->sbf[0].len & 0x3f));
    uVar4 = bf->sbf[0].len + bf->shr + bf->sbf[1].len;
    uVar8 = ~(-1L << ((byte)uVar4 & 0x3f));
    if (0x3f < uVar4) {
      uVar8 = 0xffffffffffffffff;
    }
    iVar3 = bf->wrapok;
    uVar2 = getbf(bf,res->a,res->m,(disctx *)0x0);
    uVar4 = (uint)(((uVar2 ^ expr->num1) & (-(ulong)(iVar3 == 0) | uVar8)) == 0);
  }
  else {
    iVar3 = res->nrelocs;
    lVar1 = (long)iVar3;
    if (lVar1 == 8) {
      __assert_fail("res->nrelocs != 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/polachok[P]envytools/envydis/core.c"
                    ,299,"int setbfe(struct match *, const struct bitfield *, const struct expr *)")
      ;
    }
    res->relocs[lVar1].bf = bf;
    res->relocs[lVar1].expr = expr;
    res->nrelocs = iVar3 + 1;
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

int setbfe (struct match *res, const struct bitfield *bf, const struct expr *expr) {
	if (!expr->isimm)
		return 0;
	if (expr->type != EXPR_NUM || bf->pcrel) {
		assert (res->nrelocs != 8);
		res->relocs[res->nrelocs].bf = bf;
		res->relocs[res->nrelocs].expr = expr;
		res->nrelocs++;
		return 1;
	}
	ull num = (expr->num1 - bf->addend) ^ bf->xorend;
	if (bf->lut) {
		int max = 1 << (bf->sbf[0].len + bf->sbf[1].len);
		int j = 0;
		for (j = 0; j < max; j++)
			if (bf->lut[j] == num)
				break;
		if (j == max)
			return 0;
		num = j;
	}
	num >>= bf->shr;
	setsbf(res, bf->sbf[0].pos, bf->sbf[0].len, num);
	num >>= bf->sbf[0].len;
	setsbf(res, bf->sbf[1].pos, bf->sbf[1].len, num);
	ull mask = ~0ull;
	ull totalsz = bf->shr + bf->sbf[0].len + bf->sbf[1].len;
	if (bf->wrapok && totalsz < 64)
		mask = (1ull << totalsz) - 1;
	return (getbf(bf, res->a, res->m, 0) & mask) == (expr->num1 & mask);
}